

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_ExpandWithCustomEmitter::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  int iVar4;
  Template *pTVar5;
  char *pcVar6;
  undefined1 local_148 [8];
  SizeofEmitter e;
  string output;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateDictionary local_b8 [8];
  TemplateDictionary dict;
  allocator local_31;
  string local_30 [32];
  Template *local_10;
  Template *tpl;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"{{VAR}} {{VAR}}",&local_31);
  pTVar5 = ctemplate::StringToTemplate((string *)local_30,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = pTVar5;
  ctemplate::TemplateString::TemplateString(&local_d8,"test_expand");
  ctemplate::TemplateDictionary::TemplateDictionary(local_b8,&local_d8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_f8,"VAR");
  ctemplate::TemplateString::TemplateString(&local_118,"this song is just six words long");
  TVar1.length_ = local_f8.length_;
  TVar1.ptr_ = local_f8.ptr_;
  TVar1.is_immutable_ = local_f8.is_immutable_;
  TVar1._17_7_ = local_f8._17_7_;
  TVar1.id_ = local_f8.id_;
  TVar2.length_ = local_118.length_;
  TVar2.ptr_ = local_118.ptr_;
  TVar2.is_immutable_ = local_118.is_immutable_;
  TVar2._17_7_ = local_118._17_7_;
  TVar2.id_ = local_118.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  std::__cxx11::string::string((string *)&e.outbuf_);
  anon_unknown.dwarf_a4f2::SizeofEmitter::SizeofEmitter
            ((SizeofEmitter *)local_148,(string *)&e.outbuf_);
  bVar3 = ctemplate::Template::Expand
                    (local_10,(ExpandEmitter *)local_148,(TemplateDictionaryInterface *)local_b8);
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0x430,"tpl->Expand(&e, &dict)");
    bVar3 = ctemplate::Template::Expand
                      (local_10,(ExpandEmitter *)local_148,(TemplateDictionaryInterface *)local_b8);
    if (!bVar3) {
      __assert_fail("tpl->Expand(&e, &dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x430,"static void Test_Template_ExpandWithCustomEmitter::Run()");
    }
    exit(1);
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar4 = strcmp("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",pcVar6);
  if (iVar4 == 0) {
    anon_unknown.dwarf_a4f2::SizeofEmitter::~SizeofEmitter((SizeofEmitter *)local_148);
    std::__cxx11::string::~string((string *)&e.outbuf_);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x433,
         "strcmp(\"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\" \"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\", output.c_str()) == 0"
        );
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar4 = strcmp("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",pcVar6);
  if (iVar4 == 0) {
    exit(1);
  }
  __assert_fail("strcmp(\"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\" \"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\", output.c_str()) == 0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x433,"static void Test_Template_ExpandWithCustomEmitter::Run()");
}

Assistant:

TEST(Template, ExpandWithCustomEmitter) {
  Template* tpl = StringToTemplate("{{VAR}} {{VAR}}", STRIP_WHITESPACE);
  TemplateDictionary dict("test_expand");
  dict.SetValue("VAR", "this song is just six words long");
  string output;
  SizeofEmitter e(&output);
  ASSERT(tpl->Expand(&e, &dict));
  ASSERT_STREQ("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",
               output.c_str());
}